

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

char * glfwGetGamepadName(int jid)

{
  int iVar1;
  _GLFWjoystick *js;
  _GLFWmapping *p_Stack_10;
  int jid_local;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/loganzartman[P]gl-pic-fluid/glfw/src/input.c"
                  ,0x4b4,"const char *glfwGetGamepadName(int)");
  }
  if (jid < 0x10) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      p_Stack_10 = (_GLFWmapping *)0x0;
    }
    else if ((jid < 0) || (0xf < jid)) {
      _glfwInputError(0x10003,"Invalid joystick ID %i",(ulong)(uint)jid);
      p_Stack_10 = (_GLFWmapping *)0x0;
    }
    else if (_glfw.joysticks[jid].present == 0) {
      p_Stack_10 = (_GLFWmapping *)0x0;
    }
    else {
      iVar1 = _glfwPlatformPollJoystick(_glfw.joysticks + jid,0);
      if (iVar1 == 0) {
        p_Stack_10 = (_GLFWmapping *)0x0;
      }
      else if (_glfw.joysticks[jid].mapping == (_GLFWmapping *)0x0) {
        p_Stack_10 = (_GLFWmapping *)0x0;
      }
      else {
        p_Stack_10 = _glfw.joysticks[jid].mapping;
      }
    }
    return p_Stack_10->name;
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_c_cmakelists/loganzartman[P]gl-pic-fluid/glfw/src/input.c"
                ,0x4b5,"const char *glfwGetGamepadName(int)");
}

Assistant:

GLFWAPI const char* glfwGetGamepadName(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_PRESENCE))
        return NULL;

    if (!js->mapping)
        return NULL;

    return js->mapping->name;
}